

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

partial_ordering __thiscall phosg::JSON::operator<=>(JSON *this,string *v)

{
  int res;
  add_pointer_t<const_variant_alternative_t<4UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  this_00;
  string *stored_v;
  string *v_local;
  JSON *this_local;
  
  this_00 = ::std::
            get_if<4ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                      (&this->value);
  if (this_00 ==
      (add_pointer_t<const_variant_alternative_t<4UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
       )0x0) {
    this_local._7_1_ = '\x02';
  }
  else {
    res = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_00,v);
    this_local._7_1_ = partial_ordering_for_string_compare_result(res);
  }
  return (partial_ordering)this_local._7_1_;
}

Assistant:

partial_ordering JSON::operator<=>(const string& v) const {
  const string* stored_v = get_if<4>(&this->value);
  return (stored_v == nullptr
          ? partial_ordering::unordered
          : partial_ordering_for_string_compare_result(stored_v->compare(v)));
}